

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks)

{
  uint *puVar1;
  size_t sVar2;
  const_iterator cVar3;
  SmallVector<unsigned_int,_8UL> *pSVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  uint32_t local_34;
  
  local_34 = block;
  cVar3 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&blocks->_M_h,&local_34);
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    pSVar4 = spirv_cross::CFG::get_succeeding_edges(cfg,local_34);
    if ((pSVar4->super_VectorView<unsigned_int>).buffer_size == 0) {
      bVar5 = true;
    }
    else {
      pSVar4 = spirv_cross::CFG::get_succeeding_edges(cfg,local_34);
      puVar1 = (pSVar4->super_VectorView<unsigned_int>).ptr;
      sVar2 = (pSVar4->super_VectorView<unsigned_int>).buffer_size;
      lVar6 = 0;
      do {
        bVar7 = sVar2 << 2 == lVar6;
        bVar5 = !bVar7;
        if (bVar7) {
          return bVar5;
        }
        bVar7 = exists_unaccessed_path_to_return(cfg,*(uint32_t *)((long)puVar1 + lVar6),blocks);
        lVar6 = lVar6 + 4;
      } while (!bVar7);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
		if (exists_unaccessed_path_to_return(cfg, succ, blocks))
			return true;

	return false;
}